

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> __thiscall
cmNinjaTargetGenerator::New(cmNinjaTargetGenerator *this,cmGeneratorTarget *target)

{
  TargetType TVar1;
  cmNinjaNormalTargetGenerator *this_00;
  
  TVar1 = cmGeneratorTarget::GetType(target);
  if (TVar1 < UTILITY) {
    this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0x108);
    cmNinjaNormalTargetGenerator::cmNinjaNormalTargetGenerator(this_00,target);
  }
  else if (TVar1 - UTILITY < 3) {
    this_00 = (cmNinjaNormalTargetGenerator *)operator_new(0xe8);
    cmNinjaUtilityTargetGenerator::cmNinjaUtilityTargetGenerator
              ((cmNinjaUtilityTargetGenerator *)this_00,target);
  }
  else {
    (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator = (_func_int **)0x0;
    this_00 = (cmNinjaNormalTargetGenerator *)0x0;
  }
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator = (_func_int **)this_00;
  return (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
          )(__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmNinjaTargetGenerator> cmNinjaTargetGenerator::New(
  cmGeneratorTarget* target)
{
  switch (target->GetType()) {
    case cmStateEnums::EXECUTABLE:
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::STATIC_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::OBJECT_LIBRARY:
      return cm::make_unique<cmNinjaNormalTargetGenerator>(target);

    case cmStateEnums::UTILITY:
    case cmStateEnums::INTERFACE_LIBRARY:
    case cmStateEnums::GLOBAL_TARGET:
      return cm::make_unique<cmNinjaUtilityTargetGenerator>(target);

    default:
      return std::unique_ptr<cmNinjaTargetGenerator>();
  }
}